

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CheckOperatorName(ExpressionContext *ctx,SynBase *source,InplaceStr name,
                      ArrayView<ArgumentData> argData)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ArgumentData *pAVar4;
  TypeFunction *pTVar5;
  bool local_bc;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  InplaceStr local_b8;
  InplaceStr local_a8;
  InplaceStr local_98;
  InplaceStr local_88;
  InplaceStr local_78;
  InplaceStr local_68;
  InplaceStr local_58;
  InplaceStr local_48;
  SynBase *local_38;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> argData_local;
  InplaceStr name_local;
  
  ctx_local = (ExpressionContext *)argData.data;
  argData_local._8_8_ = name.begin;
  argData_local.data._0_4_ = argData.count;
  local_38 = source;
  source_local = (SynBase *)ctx;
  InplaceStr::InplaceStr(&local_48,"~");
  bVar2 = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_48);
  local_b9 = true;
  if (!bVar2) {
    InplaceStr::InplaceStr(&local_58,"!");
    local_b9 = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_58);
  }
  iVar1 = (int)name.end;
  if (local_b9 == false) {
    InplaceStr::InplaceStr(&local_68,"+");
    bVar2 = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_68);
    local_ba = true;
    if (!bVar2) {
      InplaceStr::InplaceStr(&local_78,"-");
      local_ba = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_78);
    }
    if (local_ba == false) {
      InplaceStr::InplaceStr(&local_88,"&&");
      bVar2 = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_88);
      local_bb = true;
      if (!bVar2) {
        InplaceStr::InplaceStr(&local_98,"||");
        local_bb = InplaceStr::operator==((InplaceStr *)&argData_local.count,&local_98);
      }
      if (local_bb == false) {
        InplaceStr::InplaceStr(&local_a8,"()");
        bVar2 = InplaceStr::operator!=((InplaceStr *)&argData_local.count,&local_a8);
        local_bc = false;
        if (bVar2) {
          InplaceStr::InplaceStr(&local_b8,"[]");
          local_bc = InplaceStr::operator!=((InplaceStr *)&argData_local.count,&local_b8);
        }
        if ((local_bc != false) &&
           (uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local), uVar3 != 2
           )) {
          anon_unknown.dwarf_8df1c::Stop
                    ((ExpressionContext *)source_local,local_38,
                     "ERROR: operator \'%.*s\' definition must accept exactly two arguments",
                     (ulong)(iVar1 - argData_local.count),argData_local._8_8_);
        }
      }
      else {
        uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
        if (uVar3 == 2) {
          pAVar4 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,1);
          bVar2 = isType<TypeFunction>(pAVar4->type);
          if (bVar2) {
            pAVar4 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,1);
            pTVar5 = getType<TypeFunction>(pAVar4->type);
            uVar3 = IntrusiveList<TypeHandle>::size(&pTVar5->arguments);
            if (uVar3 == 0) {
              return;
            }
          }
        }
        anon_unknown.dwarf_8df1c::Stop
                  ((ExpressionContext *)source_local,local_38,
                   "ERROR: operator \'%.*s\' definition must accept a function returning desired type as the second argument"
                   ,(ulong)(iVar1 - argData_local.count),argData_local._8_8_);
      }
    }
    else {
      uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
      if ((uVar3 != 1) &&
         (uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local), uVar3 != 2))
      {
        anon_unknown.dwarf_8df1c::Stop
                  ((ExpressionContext *)source_local,local_38,
                   "ERROR: operator \'%.*s\' definition must accept one or two arguments",
                   (ulong)(iVar1 - argData_local.count),argData_local._8_8_);
      }
    }
  }
  else {
    uVar3 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
    if (uVar3 != 1) {
      anon_unknown.dwarf_8df1c::Stop
                ((ExpressionContext *)source_local,local_38,
                 "ERROR: operator \'%.*s\' definition must accept exactly one argument",
                 (ulong)(iVar1 - argData_local.count),argData_local._8_8_);
    }
  }
  return;
}

Assistant:

void CheckOperatorName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> argData)
{
	if(name == InplaceStr("~") || name == InplaceStr("!"))
	{
		if(argData.size() != 1)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly one argument", FMT_ISTR(name));
	}
	else if(name == InplaceStr("+") || name == InplaceStr("-"))
	{
		if(argData.size() != 1 && argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept one or two arguments", FMT_ISTR(name));
	}
	else if(name == InplaceStr("&&") || name == InplaceStr("||"))
	{
		// Two arguments with the second argument being special
		if(argData.size() != 2 || !isType<TypeFunction>(argData[1].type) || getType<TypeFunction>(argData[1].type)->arguments.size() != 0)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept a function returning desired type as the second argument", FMT_ISTR(name));
	}
	else if(name != InplaceStr("()") && name != InplaceStr("[]"))
	{
		if(argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly two arguments", FMT_ISTR(name));
	}
}